

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_BoxAlloc(Bac_Ntk_t *p,Bac_ObjType_t Type,int nIns,int nOuts,int iNtk)

{
  int iVar1;
  undefined4 local_24;
  int iObj;
  int i;
  int iNtk_local;
  int nOuts_local;
  int nIns_local;
  Bac_ObjType_t Type_local;
  Bac_Ntk_t *p_local;
  
  for (local_24 = nIns + -1; -1 < local_24; local_24 = local_24 + -1) {
    Bac_ObjAlloc(p,BAC_OBJ_BI,-1);
  }
  iVar1 = Bac_ObjAlloc(p,Type,iNtk);
  for (local_24 = 0; local_24 < nOuts; local_24 = local_24 + 1) {
    Bac_ObjAlloc(p,BAC_OBJ_BO,-1);
  }
  return iVar1;
}

Assistant:

static inline int Bac_BoxAlloc( Bac_Ntk_t * p, Bac_ObjType_t Type, int nIns, int nOuts, int iNtk )
{
    int i, iObj;
    for ( i = nIns - 1; i >= 0; i-- )
        Bac_ObjAlloc( p, BAC_OBJ_BI, -1 );
    iObj = Bac_ObjAlloc( p, Type, iNtk );
    for ( i = 0; i < nOuts; i++ )
        Bac_ObjAlloc( p, BAC_OBJ_BO, -1 );
    return iObj;
}